

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Minefield_Query_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Query_PDU *this)

{
  pointer pPVar1;
  pointer puVar2;
  KString *pKVar3;
  ostream *poVar4;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer puVar5;
  pointer pPVar6;
  KStringStream ss;
  KString local_288;
  KString local_268;
  Minefield_Query_PDU *local_248;
  KString *local_240;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_268,(Header7 *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-Minefield Query PDU-\n",0x16);
  Minefield_Header::GetAsString_abi_cxx11_(&local_288,&this->super_Minefield_Header);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_288._M_dataplus._M_p,local_288._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Requesting ID:           ",0x19);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_ReqID);
  UTILS::IndentString(&local_1f8,&local_1d8,Tabs,in_CL);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Request ID:              ",0x19);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Number Of Permim Points: ",0x19);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Number Of Sensor Types:  ",0x19);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  DATA_TYPE::MinefieldDataFilter::GetAsString_abi_cxx11_(&local_218,&this->m_DataFilter);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Mine Type Filter:        ",0x19);
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_238,&this->m_MineTypFilter);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Perimeter Points:\n",0x12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_240 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  pPVar6 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_248 = this;
  if (pPVar6 != pPVar1) {
    do {
      (*(pPVar6->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_288,pPVar6);
      UTILS::IndentString(&local_268,&local_288,Tabs_00,in_CL);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      pPVar6 = pPVar6 + 1;
    } while (pPVar6 != pPVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Sensor Types:\n",0xe);
  pKVar3 = local_240;
  puVar2 = (local_248->m_vui16SensorTypes).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (local_248->m_vui16SensorTypes).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar3;
}

Assistant:

KString Minefield_Query_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Minefield Query PDU-\n"
       << Minefield_Header::GetAsString()
       << "Requesting ID:           " << IndentString( m_ReqID.GetAsString(), 1 )
       << "Request ID:              " << ( KUINT16 )m_ui8ReqID          << "\n"
       << "Number Of Permim Points: " << ( KUINT16 )m_ui8NumPerimPoints << "\n"
       << "Number Of Sensor Types:  " << ( KUINT16 )m_ui8NumSensTyp     << "\n"
       << m_DataFilter.GetAsString()
       << "Mine Type Filter:        " << m_MineTypFilter.GetAsString()
       << "Perimeter Points:\n";

    std::vector<PerimeterPointCoordinate>::const_iterator citrPnt = m_vPoints.begin();
    std::vector<PerimeterPointCoordinate>::const_iterator citrEndPnt = m_vPoints.end();
    for( ; citrPnt != citrEndPnt; ++citrPnt )
    {
        ss << IndentString( citrPnt->GetAsString(), 1 );
    }

    ss << "Sensor Types:\n";

    std::vector<KUINT16>::const_iterator citrSt = m_vui16SensorTypes.begin();
    std::vector<KUINT16>::const_iterator citrEndSt = m_vui16SensorTypes.end();
    for( ; citrSt != citrEndSt; ++citrSt )
    {
        ss << "\t" << *citrSt << "\n";
    }

    return ss.str();
}